

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
          (CodedInputStream *this,uint64_t *value)

{
  bool bVar1;
  int iVar2;
  uint8_t **local_30;
  uint8_t *ptr;
  uint8_t bytes [8];
  uint64_t *value_local;
  CodedInputStream *this_local;
  
  bytes = (uint8_t  [8])value;
  iVar2 = BufferSize(this);
  if (iVar2 < 8) {
    bVar1 = ReadRaw(this,&ptr,8);
    if (!bVar1) {
      return false;
    }
    local_30 = &ptr;
  }
  else {
    local_30 = (uint8_t **)this->buffer_;
    Advance(this,8);
  }
  ReadLittleEndian64FromArray((uint8_t *)local_30,(uint64_t *)bytes);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian64Fallback(uint64_t* value) {
  uint8_t bytes[sizeof(*value)];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(sizeof(*value))) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian64FromArray(ptr, value);
  return true;
}